

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O1

bool anon_unknown.dwarf_1613e::CheckConsume(ParseContext *ctx,char *str,char *msg,...)

{
  char in_AL;
  undefined1 uVar1;
  undefined1 extraout_AL;
  undefined8 in_RCX;
  char *pos;
  Lexeme *begin;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  __va_list_tag local_d8;
  undefined1 local_b8 [24];
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_18;
  
  if (in_AL != '\0') {
    local_88 = in_XMM0_Qa;
    local_78 = in_XMM1_Qa;
    local_68 = in_XMM2_Qa;
    local_58 = in_XMM3_Qa;
    local_48 = in_XMM4_Qa;
    local_38 = in_XMM5_Qa;
    local_28 = in_XMM6_Qa;
    local_18 = in_XMM7_Qa;
  }
  local_a0 = in_RCX;
  local_98 = in_R8;
  local_90 = in_R9;
  uVar1 = ParseContext::Consume(ctx,"get");
  if (!(bool)uVar1) {
    local_d8.reg_save_area = local_b8;
    local_d8.overflow_arg_area = &args[0].overflow_arg_area;
    local_d8.gp_offset = 0x18;
    local_d8.fp_offset = 0x30;
    begin = ctx->currentLexeme;
    if ((begin == ctx->lastLexeme) && (begin != ctx->firstLexeme)) {
      pos = begin[-1].pos + begin[-1].length;
      begin = begin + -1;
    }
    else {
      pos = begin->pos;
    }
    ReportAt(ctx,begin,begin,pos,"ERROR: \'get\' is expected after \'{\'",&local_d8);
    uVar1 = extraout_AL;
  }
  return (bool)uVar1;
}

Assistant:

bool CheckConsume(ParseContext &ctx, const char *str, const char *msg, ...)
	{
		if(!ctx.Consume(str))
		{
			va_list args;
			va_start(args, msg);

			Lexeme *curr = ctx.Current();

			if(curr == ctx.Last() && curr != ctx.First())
				ReportAt(ctx, curr - 1, curr - 1, (curr - 1)->pos + (curr - 1)->length, msg, args);
			else
				ReportAt(ctx, curr, curr, curr->pos, msg, args);

			va_end(args);

			return false;
		}

		return true;
	}